

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandAbc9AbsRefine(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Gia_Man_t *pGia;
  int iVar1;
  int iVar2;
  char *pcVar3;
  uint fVerbose;
  uint fSensePath;
  char *pcVar4;
  uint fTryFour;
  uint local_40;
  
  local_40 = 0;
  Extra_UtilGetoptReset();
  fTryFour = 1;
  fSensePath = 0;
  fVerbose = 0;
  while( true ) {
    while( true ) {
      while( true ) {
        while (iVar1 = Extra_UtilGetopt(argc,argv,"Mtsvh"), iVar2 = globalUtilOptind, iVar1 == 0x76)
        {
          fVerbose = fVerbose ^ 1;
        }
        if (iVar1 == -1) {
          pGia = pAbc->pGia;
          if (pGia == (Gia_Man_t *)0x0) {
            pcVar3 = "Abc_CommandAbc9AbsRefine(): There is no AIG.\n";
          }
          else {
            if (pGia->nRegs == 0) {
              Abc_Print(-1,"The network is combinational.\n");
              return 0;
            }
            if (pAbc->pCex != (Abc_Cex_t *)0x0) {
              iVar2 = Gia_ManCexAbstractionRefine
                                (pGia,pAbc->pCex,local_40,fTryFour,fSensePath,fVerbose);
              pAbc->Status = iVar2;
              Abc_FrameReplaceCex(pAbc,&pAbc->pGia->pCexSeq);
              return 0;
            }
            pcVar3 = "Abc_CommandAbc9AbsRefine(): There is no counter-example.\n";
          }
          iVar2 = -1;
          goto LAB_0026036b;
        }
        if (iVar1 != 0x74) break;
        fTryFour = fTryFour ^ 1;
      }
      if (iVar1 != 0x73) break;
      fSensePath = fSensePath ^ 1;
    }
    if (iVar1 != 0x4d) goto LAB_002602cd;
    if (argc <= globalUtilOptind) break;
    local_40 = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar2 + 1;
    if ((int)local_40 < 0) {
LAB_002602cd:
      iVar2 = -2;
      Abc_Print(-2,"usage: &abs_refine [-M <num>] [-tsvh]\n");
      Abc_Print(-2,"\t         refines the pre-computed flop map using the counter-example\n");
      Abc_Print(-2,"\t-M num : the max number of flops to add (0 = not used) [default = %d]\n",
                (ulong)local_40);
      pcVar4 = "yes";
      pcVar3 = "yes";
      if (fTryFour == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-t     : toggle trying four abstractions instead of one [default = %s]\n",
                pcVar3);
      pcVar3 = "yes";
      if (fSensePath == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-s     : toggle using the path sensitization algorithm [default = %s]\n",
                pcVar3);
      if (fVerbose == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar4);
      pcVar3 = "\t-h     : print the command usage\n";
LAB_0026036b:
      Abc_Print(iVar2,pcVar3);
      return 1;
    }
  }
  Abc_Print(-1,"Command line switch \"-M\" should be followed by an integer.\n");
  goto LAB_002602cd;
}

Assistant:

int Abc_CommandAbc9AbsRefine( Abc_Frame_t * pAbc, int argc, char ** argv )
{
//    Gia_Man_t * pTemp = NULL;
    int c;
    int nFfToAddMax = 0;
    int fTryFour    = 1;
    int fSensePath  = 0;
    int fVerbose    = 0;

    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Mtsvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'M':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-M\" should be followed by an integer.\n" );
                goto usage;
            }
            nFfToAddMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nFfToAddMax < 0 )
                goto usage;
            break;
        case 't':
            fTryFour ^= 1;
            break;
        case 's':
            fSensePath ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9AbsRefine(): There is no AIG.\n" );
        return 1;
    }
    if ( Gia_ManRegNum(pAbc->pGia) == 0 )
    {
        Abc_Print( -1, "The network is combinational.\n" );
        return 0;
    }
    if ( pAbc->pCex == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9AbsRefine(): There is no counter-example.\n" );
        return 1;
    }
    pAbc->Status = Gia_ManCexAbstractionRefine( pAbc->pGia, pAbc->pCex, nFfToAddMax, fTryFour, fSensePath, fVerbose );
    Abc_FrameReplaceCex( pAbc, &pAbc->pGia->pCexSeq );
    return 0;

usage:
    Abc_Print( -2, "usage: &abs_refine [-M <num>] [-tsvh]\n" );
    Abc_Print( -2, "\t         refines the pre-computed flop map using the counter-example\n" );
    Abc_Print( -2, "\t-M num : the max number of flops to add (0 = not used) [default = %d]\n", nFfToAddMax );
    Abc_Print( -2, "\t-t     : toggle trying four abstractions instead of one [default = %s]\n", fTryFour? "yes": "no" );
    Abc_Print( -2, "\t-s     : toggle using the path sensitization algorithm [default = %s]\n", fSensePath? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}